

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_TextExtra::Read(ON_OBSOLETE_V5_TextExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_29;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_OBSOLETE_V5_TextExtra *this_local;
  
  iStack_24 = 1;
  local_28 = 0;
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  local_29 = ON_BinaryArchive::BeginRead3dmChunk
                       (archive,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if (local_29) {
    if (iStack_24 == 1) {
      if (local_29) {
        local_29 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_parent_uuid);
      }
      if (local_29 != false) {
        local_29 = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bDrawMask);
      }
      if (local_29 != false) {
        local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_color_source);
      }
      if (local_29 != false) {
        local_29 = ON_BinaryArchive::ReadColor(_minor_version,&this->m_mask_color);
      }
      if (local_29 != false) {
        local_29 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_border_offset);
      }
      bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
      if (!bVar1) {
        local_29 = false;
      }
      this_local._7_1_ = local_29;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_OBSOLETE_V5_TextExtra::Read(ON_BinaryArchive& archive)
{
  int major_version = 1;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if(!rc)
    return false;
  if(major_version != 1)
    return false;

  if(rc) rc = archive.ReadUuid(m_parent_uuid);
  if(rc) rc = archive.ReadBool(&m_bDrawMask);
  if(rc) rc = archive.ReadInt(&m_color_source);
  if(rc) rc = archive.ReadColor(m_mask_color);
  if(rc) rc = archive.ReadDouble(&m_border_offset);

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}